

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O1

Aig_MmFlex_t * Aig_MmFlexStart(void)

{
  Aig_MmFlex_t *pAVar1;
  char **ppcVar2;
  
  pAVar1 = (Aig_MmFlex_t *)malloc(0x38);
  pAVar1->pEnd = (char *)0x0;
  pAVar1->nChunkSize = 0;
  pAVar1->nChunksAlloc = 0;
  *(undefined8 *)&pAVar1->nChunks = 0;
  pAVar1->pChunks = (char **)0x0;
  *(undefined8 *)pAVar1 = 0;
  pAVar1->pCurrent = (char *)0x0;
  pAVar1->nMemoryUsed = 0;
  pAVar1->nMemoryAlloc = 0;
  pAVar1->nChunkSize = 0x40000;
  pAVar1->nChunksAlloc = 0x40;
  pAVar1->nChunks = 0;
  ppcVar2 = (char **)malloc(0x200);
  pAVar1->pChunks = ppcVar2;
  pAVar1->nMemoryUsed = 0;
  pAVar1->nMemoryAlloc = 0;
  return pAVar1;
}

Assistant:

Aig_MmFlex_t * Aig_MmFlexStart()
{
    Aig_MmFlex_t * p;

    p = ABC_ALLOC( Aig_MmFlex_t, 1 );
    memset( p, 0, sizeof(Aig_MmFlex_t) );

    p->nEntriesUsed  = 0;
    p->pCurrent      = NULL;
    p->pEnd          = NULL;

    p->nChunkSize    = (1 << 18);
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}